

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O1

bool Imath_3_2::extractSHRT<float>
               (Matrix33<float> *mat,Vec2<float> *s,float *h,float *r,Vec2<float> *t,bool exc)

{
  bool bVar1;
  Matrix33<float> local_48;
  
  local_48.x[0]._0_8_ = *(undefined8 *)mat->x[0];
  local_48.x._8_8_ = *(undefined8 *)(mat->x[0] + 2);
  local_48.x[1]._4_8_ = *(undefined8 *)(mat->x[1] + 1);
  local_48.x[2]._0_8_ = *(undefined8 *)mat->x[2];
  local_48.x[2][2] = mat->x[2][2];
  bVar1 = extractAndRemoveScalingAndShear<float>(&local_48,s,h,exc);
  if (bVar1) {
    extractEuler<float>(&local_48,r);
    t->x = mat->x[2][0];
    t->y = mat->x[2][1];
  }
  return bVar1;
}

Assistant:

bool
extractSHRT (
    const Matrix33<T>& mat, Vec2<T>& s, T& h, T& r, Vec2<T>& t, bool exc)
{
    Matrix33<T> rot;

    rot = mat;
    if (!extractAndRemoveScalingAndShear (rot, s, h, exc)) return false;

    extractEuler (rot, r);

    t.x = mat[2][0];
    t.y = mat[2][1];

    return true;
}